

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::PlusExp(SQCompiler *this)

{
  long tok;
  SQOpcode op;
  
  MultExp(this);
  while ((tok = this->_token, tok == 0x2d || (tok == 0x2b))) {
    op = ChooseArithOpByToken(this,tok);
    BIN_EXP<void(SQCompiler::*)()>(this,op,(offset_in_SQCompiler_to_subr)MultExp,0);
  }
  return;
}

Assistant:

void PlusExp()
    {
        MultExp();
        for(;;) switch(_token) {
        case _SC('+'): case _SC('-'):
            BIN_EXP(ChooseArithOpByToken(_token), &SQCompiler::MultExp); break;
        default: return;
        }
    }